

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O0

axl_va_list * __thiscall
axl::sl::Pack<unsigned_int>::operator()
          (Pack<unsigned_int> *this,void *p,size_t *size,axl_va_list *va)

{
  uint uVar1;
  undefined8 *in_RCX;
  uint *in_RDX;
  axl_va_list *in_RDI;
  axl_va_list *in_R8;
  uint a;
  axl_va_list *this_00;
  
  this_00 = in_RDI;
  uVar1 = axl_va_list::arg<unsigned_int>(in_R8);
  *in_RCX = 4;
  if (in_RDX != (uint *)0x0) {
    *in_RDX = uVar1;
  }
  axl_va_list::axl_va_list(this_00,in_R8);
  return in_RDI;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		T a = va.arg<T> ();

		*size = sizeof(T);

		if (p)
			*(T*)p = a;

		return va;
	}